

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_info.cc
# Opt level: O3

void __thiscall absl::cord_internal::CordzInfo::Track(CordzInfo *this)

{
  uint uVar1;
  List *this_00;
  uint uVar2;
  __pointer_type pCVar3;
  
  this_00 = this->list_;
  uVar1 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
  if ((uVar1 & 1) == 0) {
    LOCK();
    uVar2 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
    if (uVar1 == uVar2) {
      (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i = uVar1 | 1;
      uVar2 = uVar1;
    }
    UNLOCK();
    if ((uVar2 & 1) == 0) goto LAB_0013832a;
  }
  base_internal::SpinLock::SlowLock(&this_00->mutex);
LAB_0013832a:
  pCVar3 = (this->list_->head)._M_b._M_p;
  if (pCVar3 == (__pointer_type)0x0) {
    pCVar3 = (__pointer_type)0x0;
  }
  else {
    (pCVar3->ci_prev_)._M_b._M_p = this;
  }
  (this->ci_next_)._M_b._M_p = pCVar3;
  (this->list_->head)._M_b._M_p = this;
  LOCK();
  uVar1 = (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i;
  (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i =
       (this_00->mutex).lockword_.super___atomic_base<unsigned_int>._M_i & 2;
  UNLOCK();
  if (7 < uVar1) {
    base_internal::SpinLock::SlowUnlock(&this_00->mutex,uVar1);
    return;
  }
  return;
}

Assistant:

void CordzInfo::Track() {
  SpinLockHolder l(&list_->mutex);

  CordzInfo* const head = list_->head.load(std::memory_order_acquire);
  if (head != nullptr) {
    head->ci_prev_.store(this, std::memory_order_release);
  }
  ci_next_.store(head, std::memory_order_release);
  list_->head.store(this, std::memory_order_release);
}